

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O3

BBox3fa * __thiscall
embree::avx512::
CurveGeometryISA<(embree::Geometry::GType)1,_embree::avx512::CurveGeometryInterface,_embree::CatmullRomCurveT>
::vbounds(BBox3fa *__return_storage_ptr__,
         CurveGeometryISA<(embree::Geometry::GType)1,_embree::avx512::CurveGeometryInterface,_embree::CatmullRomCurveT>
         *this,size_t i)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  uint uVar4;
  BufferView<embree::Vec3fx> *pBVar5;
  char *pcVar6;
  size_t sVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  float fVar10;
  float fVar11;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar12;
  undefined1 auVar13 [12];
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  
  pBVar5 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
           vertices.items;
  uVar4 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                              super_CurveGeometry.super_Geometry.field_0x58 +
                   i * *(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                                 super_CurveGeometry.field_0x68);
  pcVar6 = (pBVar5->super_RawBufferView).ptr_ofs;
  sVar7 = (pBVar5->super_RawBufferView).stride;
  lVar14 = uVar4 * sVar7;
  lVar15 = (uVar4 + 1) * sVar7;
  lVar16 = (uVar4 + 2) * sVar7;
  lVar17 = (uVar4 + 3) * sVar7;
  fVar1 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
          maxRadiusScale;
  fVar10 = fVar1 * *(float *)(pcVar6 + lVar14 + 0xc);
  fVar11 = fVar1 * *(float *)(pcVar6 + lVar15 + 0xc);
  uVar2 = *(undefined4 *)(pcVar6 + lVar14);
  auVar41._4_4_ = uVar2;
  auVar41._0_4_ = uVar2;
  auVar41._8_4_ = uVar2;
  auVar41._12_4_ = uVar2;
  auVar41._16_4_ = uVar2;
  auVar41._20_4_ = uVar2;
  auVar41._24_4_ = uVar2;
  auVar41._28_4_ = uVar2;
  uVar2 = *(undefined4 *)(pcVar6 + lVar14 + 4);
  auVar31._4_4_ = uVar2;
  auVar31._0_4_ = uVar2;
  auVar31._8_4_ = uVar2;
  auVar31._12_4_ = uVar2;
  auVar31._16_4_ = uVar2;
  auVar31._20_4_ = uVar2;
  auVar31._24_4_ = uVar2;
  auVar31._28_4_ = uVar2;
  uVar3 = *(undefined4 *)(pcVar6 + lVar14 + 8);
  auVar30._4_4_ = uVar3;
  auVar30._0_4_ = uVar3;
  auVar30._8_4_ = uVar3;
  auVar30._12_4_ = uVar3;
  auVar30._16_4_ = uVar3;
  auVar30._20_4_ = uVar3;
  auVar30._24_4_ = uVar3;
  auVar30._28_4_ = uVar3;
  uVar3 = *(undefined4 *)(pcVar6 + lVar15);
  auVar46._4_4_ = uVar3;
  auVar46._0_4_ = uVar3;
  auVar46._8_4_ = uVar3;
  auVar46._12_4_ = uVar3;
  auVar46._16_4_ = uVar3;
  auVar46._20_4_ = uVar3;
  auVar46._24_4_ = uVar3;
  auVar46._28_4_ = uVar3;
  uVar3 = *(undefined4 *)(pcVar6 + lVar15 + 4);
  auVar45._4_4_ = uVar3;
  auVar45._0_4_ = uVar3;
  auVar45._8_4_ = uVar3;
  auVar45._12_4_ = uVar3;
  auVar45._16_4_ = uVar3;
  auVar45._20_4_ = uVar3;
  auVar45._24_4_ = uVar3;
  auVar45._28_4_ = uVar3;
  uVar3 = *(undefined4 *)(pcVar6 + lVar15 + 8);
  auVar43._4_4_ = uVar3;
  auVar43._0_4_ = uVar3;
  auVar43._8_4_ = uVar3;
  auVar43._12_4_ = uVar3;
  auVar43._16_4_ = uVar3;
  auVar43._20_4_ = uVar3;
  auVar43._24_4_ = uVar3;
  auVar43._28_4_ = uVar3;
  auVar32._4_4_ = fVar10;
  auVar32._0_4_ = fVar10;
  auVar32._8_4_ = fVar10;
  auVar32._12_4_ = fVar10;
  auVar32._16_4_ = fVar10;
  auVar32._20_4_ = fVar10;
  auVar32._24_4_ = fVar10;
  auVar32._28_4_ = fVar10;
  auVar44._4_4_ = fVar11;
  auVar44._0_4_ = fVar11;
  auVar44._8_4_ = fVar11;
  auVar44._12_4_ = fVar11;
  auVar44._16_4_ = fVar11;
  auVar44._20_4_ = fVar11;
  auVar44._24_4_ = fVar11;
  auVar44._28_4_ = fVar11;
  uVar3 = *(undefined4 *)(pcVar6 + lVar16);
  auVar47._4_4_ = uVar3;
  auVar47._0_4_ = uVar3;
  auVar47._8_4_ = uVar3;
  auVar47._12_4_ = uVar3;
  auVar47._16_4_ = uVar3;
  auVar47._20_4_ = uVar3;
  auVar47._24_4_ = uVar3;
  auVar47._28_4_ = uVar3;
  uVar3 = *(undefined4 *)(pcVar6 + lVar16 + 4);
  auVar48._4_4_ = uVar3;
  auVar48._0_4_ = uVar3;
  auVar48._8_4_ = uVar3;
  auVar48._12_4_ = uVar3;
  auVar48._16_4_ = uVar3;
  auVar48._20_4_ = uVar3;
  auVar48._24_4_ = uVar3;
  auVar48._28_4_ = uVar3;
  uVar3 = *(undefined4 *)(pcVar6 + lVar16 + 8);
  auVar49._4_4_ = uVar3;
  auVar49._0_4_ = uVar3;
  auVar49._8_4_ = uVar3;
  auVar49._12_4_ = uVar3;
  auVar49._16_4_ = uVar3;
  auVar49._20_4_ = uVar3;
  auVar49._24_4_ = uVar3;
  auVar49._28_4_ = uVar3;
  fVar10 = *(float *)(pcVar6 + lVar17);
  auVar50._4_4_ = fVar10;
  auVar50._0_4_ = fVar10;
  auVar50._8_4_ = fVar10;
  auVar50._12_4_ = fVar10;
  auVar50._16_4_ = fVar10;
  auVar50._20_4_ = fVar10;
  auVar50._24_4_ = fVar10;
  auVar50._28_4_ = fVar10;
  auVar18 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(pcVar6 + lVar17 + 4)));
  auVar19 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar1 * *(float *)(pcVar6 + lVar16 + 0xc))));
  auVar20 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(pcVar6 + lVar17 + 8)));
  auVar21 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar1 * *(float *)(pcVar6 + lVar17 + 0xc))));
  auVar25._0_4_ = fVar10 * catmullrom_basis0._3944_4_;
  auVar25._4_4_ = fVar10 * catmullrom_basis0._3948_4_;
  auVar25._8_4_ = fVar10 * catmullrom_basis0._3952_4_;
  auVar25._12_4_ = fVar10 * catmullrom_basis0._3956_4_;
  auVar25._16_4_ = fVar10 * catmullrom_basis0._3960_4_;
  auVar25._20_4_ = fVar10 * catmullrom_basis0._3964_4_;
  auVar25._24_4_ = fVar10 * catmullrom_basis0._3968_4_;
  auVar25._28_4_ = 0;
  auVar22 = vmulps_avx512vl(auVar18,catmullrom_basis0._3944_32_);
  auVar23 = vmulps_avx512vl(auVar20,catmullrom_basis0._3944_32_);
  auVar24 = vmulps_avx512vl(auVar21,catmullrom_basis0._3944_32_);
  auVar25 = vfmadd231ps_avx512vl(auVar25,catmullrom_basis0._2788_32_,auVar47);
  auVar22 = vfmadd231ps_avx512vl(auVar22,catmullrom_basis0._2788_32_,auVar48);
  auVar23 = vfmadd231ps_avx512vl(auVar23,catmullrom_basis0._2788_32_,auVar49);
  auVar24 = vfmadd231ps_avx512vl(auVar24,auVar19,catmullrom_basis0._2788_32_);
  auVar25 = vfmadd231ps_avx512vl(auVar25,catmullrom_basis0._1632_32_,auVar46);
  auVar22 = vfmadd231ps_avx512vl(auVar22,catmullrom_basis0._1632_32_,auVar45);
  auVar23 = vfmadd231ps_avx512vl(auVar23,catmullrom_basis0._1632_32_,auVar43);
  auVar24 = vfmadd231ps_avx512vl(auVar24,auVar44,catmullrom_basis0._1632_32_);
  auVar26 = vfmadd231ps_avx512vl(auVar25,catmullrom_basis0._476_32_,auVar41);
  auVar27 = vfmadd231ps_avx512vl(auVar22,catmullrom_basis0._476_32_,auVar31);
  auVar28 = vfmadd231ps_avx512vl(auVar23,catmullrom_basis0._476_32_,auVar30);
  auVar29 = vfmadd231ps_avx512vl(auVar24,auVar32,catmullrom_basis0._476_32_);
  auVar22 = vmulps_avx512vl(auVar50,catmullrom_basis0._8568_32_);
  auVar18 = vmulps_avx512vl(auVar18,catmullrom_basis0._8568_32_);
  auVar20 = vmulps_avx512vl(auVar20,catmullrom_basis0._8568_32_);
  auVar21 = vmulps_avx512vl(auVar21,catmullrom_basis0._8568_32_);
  auVar22 = vfmadd231ps_avx512vl(auVar22,catmullrom_basis0._7412_32_,auVar47);
  auVar18 = vfmadd231ps_avx512vl(auVar18,catmullrom_basis0._7412_32_,auVar48);
  auVar20 = vfmadd231ps_avx512vl(auVar20,catmullrom_basis0._7412_32_,auVar49);
  auVar19 = vfmadd231ps_avx512vl(auVar21,catmullrom_basis0._7412_32_,auVar19);
  auVar21 = vfmadd231ps_avx512vl(auVar22,catmullrom_basis0._6256_32_,auVar46);
  auVar18 = vfmadd231ps_avx512vl(auVar18,catmullrom_basis0._6256_32_,auVar45);
  auVar20 = vfmadd231ps_avx512vl(auVar20,catmullrom_basis0._6256_32_,auVar43);
  auVar19 = vfmadd231ps_avx512vl(auVar19,catmullrom_basis0._6256_32_,auVar44);
  auVar21 = vfmadd231ps_avx512vl(auVar21,catmullrom_basis0._5100_32_,auVar41);
  auVar18 = vfmadd231ps_avx512vl(auVar18,catmullrom_basis0._5100_32_,auVar31);
  auVar20 = vfmadd231ps_avx512vl(auVar20,catmullrom_basis0._5100_32_,auVar30);
  auVar22._8_4_ = 0x3d638e39;
  auVar22._0_8_ = 0x3d638e393d638e39;
  auVar22._12_4_ = 0x3d638e39;
  auVar22._16_4_ = 0x3d638e39;
  auVar22._20_4_ = 0x3d638e39;
  auVar22._24_4_ = 0x3d638e39;
  auVar22._28_4_ = 0x3d638e39;
  auVar19 = vfmadd231ps_avx512vl(auVar19,catmullrom_basis0._5100_32_,auVar32);
  auVar33._4_4_ = auVar21._4_4_ * 0.055555556;
  auVar33._0_4_ = auVar21._0_4_ * 0.055555556;
  auVar33._8_4_ = auVar21._8_4_ * 0.055555556;
  auVar33._12_4_ = auVar21._12_4_ * 0.055555556;
  auVar33._16_4_ = auVar21._16_4_ * 0.055555556;
  auVar33._20_4_ = auVar21._20_4_ * 0.055555556;
  auVar33._24_4_ = auVar21._24_4_ * 0.055555556;
  auVar33._28_4_ = uVar2;
  auVar30 = vmulps_avx512vl(auVar18,auVar22);
  auVar31 = vmulps_avx512vl(auVar20,auVar22);
  auVar32 = vmulps_avx512vl(auVar19,auVar22);
  auVar13 = ZEXT412(0);
  auVar18 = vblendps_avx(auVar33,ZEXT1232(auVar13) << 0x20,1);
  auVar19 = vblendps_avx(auVar30,ZEXT1232(auVar13) << 0x20,1);
  auVar38 = ZEXT1232(auVar13) << 0x20;
  auVar20 = vblendps_avx(auVar31,auVar38,1);
  auVar21 = vblendps_avx(auVar32,auVar38,1);
  auVar22 = vsubps_avx(auVar26,auVar18);
  auVar23 = vsubps_avx(auVar27,auVar19);
  auVar24 = vsubps_avx(auVar28,auVar20);
  auVar25 = vsubps_avx(auVar29,auVar21);
  auVar18 = vblendps_avx(auVar33,auVar38,0x80);
  auVar19 = vblendps_avx(auVar30,auVar38,0x80);
  auVar20 = vblendps_avx(auVar31,ZEXT1232(auVar13) << 0x20,0x80);
  auVar21 = vblendps_avx(auVar32,ZEXT1232(auVar13) << 0x20,0x80);
  auVar39._0_4_ = auVar26._0_4_ + auVar18._0_4_;
  auVar39._4_4_ = auVar26._4_4_ + auVar18._4_4_;
  auVar39._8_4_ = auVar26._8_4_ + auVar18._8_4_;
  auVar39._12_4_ = auVar26._12_4_ + auVar18._12_4_;
  auVar39._16_4_ = auVar26._16_4_ + auVar18._16_4_;
  auVar39._20_4_ = auVar26._20_4_ + auVar18._20_4_;
  auVar39._24_4_ = auVar26._24_4_ + auVar18._24_4_;
  auVar39._28_4_ = auVar26._28_4_ + auVar18._28_4_;
  auVar40._0_4_ = auVar27._0_4_ + auVar19._0_4_;
  auVar40._4_4_ = auVar27._4_4_ + auVar19._4_4_;
  auVar40._8_4_ = auVar27._8_4_ + auVar19._8_4_;
  auVar40._12_4_ = auVar27._12_4_ + auVar19._12_4_;
  auVar40._16_4_ = auVar27._16_4_ + auVar19._16_4_;
  auVar40._20_4_ = auVar27._20_4_ + auVar19._20_4_;
  auVar40._24_4_ = auVar27._24_4_ + auVar19._24_4_;
  auVar40._28_4_ = auVar27._28_4_ + auVar19._28_4_;
  auVar42._0_4_ = auVar28._0_4_ + auVar20._0_4_;
  auVar42._4_4_ = auVar28._4_4_ + auVar20._4_4_;
  auVar42._8_4_ = auVar28._8_4_ + auVar20._8_4_;
  auVar42._12_4_ = auVar28._12_4_ + auVar20._12_4_;
  auVar42._16_4_ = auVar28._16_4_ + auVar20._16_4_;
  auVar42._20_4_ = auVar28._20_4_ + auVar20._20_4_;
  auVar42._24_4_ = auVar28._24_4_ + auVar20._24_4_;
  auVar42._28_4_ = auVar28._28_4_ + auVar20._28_4_;
  auVar38._0_4_ = auVar29._0_4_ + auVar21._0_4_;
  auVar38._4_4_ = auVar29._4_4_ + auVar21._4_4_;
  auVar38._8_4_ = auVar29._8_4_ + auVar21._8_4_;
  auVar38._12_4_ = auVar29._12_4_ + auVar21._12_4_;
  auVar38._16_4_ = auVar29._16_4_ + auVar21._16_4_;
  auVar38._20_4_ = auVar29._20_4_ + auVar21._20_4_;
  auVar38._24_4_ = auVar29._24_4_ + auVar21._24_4_;
  auVar38._28_4_ = auVar29._28_4_ + auVar21._28_4_;
  auVar21._8_4_ = 0x7f800000;
  auVar21._0_8_ = 0x7f8000007f800000;
  auVar21._12_4_ = 0x7f800000;
  auVar21._16_4_ = 0x7f800000;
  auVar21._20_4_ = 0x7f800000;
  auVar21._24_4_ = 0x7f800000;
  auVar21._28_4_ = 0x7f800000;
  auVar18 = vminps_avx(auVar21,auVar26);
  auVar19 = vminps_avx(auVar21,auVar27);
  auVar20 = vminps_avx(auVar21,auVar28);
  auVar21 = vminps_avx(auVar21,auVar29);
  auVar33 = vminps_avx512vl(auVar22,auVar39);
  auVar33 = vminps_avx512vl(auVar18,auVar33);
  auVar18 = vminps_avx512vl(auVar23,auVar40);
  auVar30 = vminps_avx512vl(auVar19,auVar18);
  auVar18 = vminps_avx512vl(auVar24,auVar42);
  auVar31 = vminps_avx512vl(auVar20,auVar18);
  auVar18 = vminps_avx512vl(auVar25,auVar38);
  auVar32 = vminps_avx512vl(auVar21,auVar18);
  auVar18 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
  auVar19 = vmaxps_avx512vl(auVar18,auVar26);
  auVar20 = vmaxps_avx512vl(auVar18,auVar27);
  auVar21 = vmaxps_avx512vl(auVar18,auVar28);
  auVar26 = vmaxps_avx512vl(auVar18,auVar29);
  auVar18 = vmaxps_avx(auVar22,auVar39);
  auVar18 = vmaxps_avx(auVar19,auVar18);
  auVar19 = vmaxps_avx(auVar23,auVar40);
  auVar19 = vmaxps_avx(auVar20,auVar19);
  auVar20 = vmaxps_avx(auVar24,auVar42);
  auVar20 = vmaxps_avx(auVar21,auVar20);
  auVar21 = vmaxps_avx(auVar25,auVar38);
  auVar21 = vmaxps_avx(auVar26,auVar21);
  auVar22 = vshufps_avx(auVar33,auVar33,0xb1);
  auVar22 = vminps_avx(auVar33,auVar22);
  auVar23 = vshufpd_avx(auVar22,auVar22,5);
  auVar22 = vminps_avx(auVar22,auVar23);
  auVar35 = vminps_avx(auVar22._0_16_,auVar22._16_16_);
  auVar22 = vshufps_avx(auVar30,auVar30,0xb1);
  auVar22 = vminps_avx(auVar30,auVar22);
  auVar23 = vshufpd_avx(auVar22,auVar22,5);
  auVar22 = vminps_avx(auVar22,auVar23);
  auVar36 = vminps_avx(auVar22._0_16_,auVar22._16_16_);
  auVar36 = vunpcklps_avx(auVar35,auVar36);
  auVar22 = vshufps_avx(auVar31,auVar31,0xb1);
  auVar22 = vminps_avx(auVar31,auVar22);
  auVar23 = vshufpd_avx(auVar22,auVar22,5);
  auVar22 = vminps_avx(auVar22,auVar23);
  auVar35 = vminps_avx(auVar22._0_16_,auVar22._16_16_);
  auVar8 = vinsertps_avx(auVar36,auVar35,0x28);
  auVar22 = vshufps_avx(auVar18,auVar18,0xb1);
  auVar18 = vmaxps_avx(auVar18,auVar22);
  auVar22 = vshufpd_avx(auVar18,auVar18,5);
  auVar18 = vmaxps_avx(auVar18,auVar22);
  auVar35 = vmaxps_avx(auVar18._0_16_,auVar18._16_16_);
  auVar18 = vshufps_avx(auVar19,auVar19,0xb1);
  auVar18 = vmaxps_avx(auVar19,auVar18);
  auVar19 = vshufpd_avx(auVar18,auVar18,5);
  auVar18 = vmaxps_avx(auVar18,auVar19);
  auVar36 = vmaxps_avx(auVar18._0_16_,auVar18._16_16_);
  auVar36 = vunpcklps_avx(auVar35,auVar36);
  auVar18 = vshufps_avx(auVar20,auVar20,0xb1);
  auVar18 = vmaxps_avx(auVar20,auVar18);
  auVar19 = vshufpd_avx(auVar18,auVar18,5);
  auVar18 = vmaxps_avx(auVar18,auVar19);
  auVar35 = vmaxps_avx(auVar18._0_16_,auVar18._16_16_);
  auVar9 = vinsertps_avx(auVar36,auVar35,0x28);
  auVar18 = vshufps_avx(auVar32,auVar32,0xb1);
  auVar18 = vminps_avx(auVar32,auVar18);
  auVar19 = vshufpd_avx(auVar18,auVar18,5);
  auVar18 = vminps_avx(auVar18,auVar19);
  auVar35 = vminss_avx(auVar18._0_16_,auVar18._16_16_);
  auVar18 = vshufps_avx(auVar21,auVar21,0xb1);
  auVar18 = vmaxps_avx(auVar21,auVar18);
  auVar19 = vshufpd_avx(auVar18,auVar18,5);
  auVar18 = vmaxps_avx(auVar18,auVar19);
  auVar36 = vmaxss_avx(auVar18._0_16_,auVar18._16_16_);
  auVar37._8_4_ = 0x7fffffff;
  auVar37._0_8_ = 0x7fffffff7fffffff;
  auVar37._12_4_ = 0x7fffffff;
  auVar35 = vandps_avx(auVar35,auVar37);
  auVar36 = vandps_avx(auVar36,auVar37);
  auVar35 = vmaxss_avx(auVar36,auVar35);
  auVar35._4_4_ = auVar35._0_4_;
  auVar35._8_4_ = auVar35._0_4_;
  auVar35._12_4_ = auVar35._0_4_;
  auVar8 = vsubps_avx(auVar8,auVar35);
  auVar34._0_4_ = auVar9._0_4_ + auVar35._0_4_;
  auVar34._4_4_ = auVar9._4_4_ + auVar35._0_4_;
  auVar34._8_4_ = auVar9._8_4_ + auVar35._0_4_;
  auVar34._12_4_ = auVar9._12_4_ + auVar35._0_4_;
  auVar35 = vandps_avx(auVar8,auVar37);
  auVar36 = vandps_avx(auVar34,auVar37);
  auVar35 = vmaxps_avx(auVar35,auVar36);
  auVar36 = vmovshdup_avx(auVar35);
  auVar36 = vmaxss_avx(auVar36,auVar35);
  auVar35 = vshufpd_avx(auVar35,auVar35,1);
  auVar35 = vmaxss_avx(auVar35,auVar36);
  fVar1 = auVar35._0_4_ * 4.7683716e-07;
  auVar36._4_4_ = fVar1;
  auVar36._0_4_ = fVar1;
  auVar36._8_4_ = fVar1;
  auVar36._12_4_ = fVar1;
  aVar12 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vsubps_avx(auVar8,auVar36);
  (__return_storage_ptr__->lower).field_0 = aVar12;
  (__return_storage_ptr__->upper).field_0.m128[0] = auVar34._0_4_ + fVar1;
  (__return_storage_ptr__->upper).field_0.m128[1] = auVar34._4_4_ + fVar1;
  (__return_storage_ptr__->upper).field_0.m128[2] = auVar34._8_4_ + fVar1;
  (__return_storage_ptr__->upper).field_0.m128[3] = auVar34._12_4_ + fVar1;
  return __return_storage_ptr__;
}

Assistant:

BBox3fa vbounds(size_t i) const {
        return bounds(i);
      }